

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_filter.hpp
# Opt level: O2

void MeanField::Filtering::applyGaussianKernelY
               (float *input,float *output,float *kernel,float sd,int dim,int x,int y,int W,int H)

{
  float fVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  float *pfVar5;
  int i;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  
  uVar8 = 0;
  uVar6 = 0xffffffffffffffff;
  if (-1 < dim) {
    uVar6 = (ulong)(uint)dim << 2;
  }
  uVar9 = 0;
  if (0 < dim) {
    uVar9 = (ulong)(uint)dim;
  }
  pvVar2 = operator_new__(uVar6);
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    *(undefined4 *)((long)pvVar2 + uVar8 * 4) = 0;
  }
  iVar3 = (int)sd;
  lVar4 = (long)-iVar3;
  pfVar5 = input + ((y + lVar4) * (long)W + (long)x) * (long)dim;
  fVar10 = 0.0;
  for (; lVar4 <= iVar3; lVar4 = lVar4 + 1) {
    lVar7 = lVar4 + y;
    if (lVar7 < H && -1 < lVar7) {
      fVar1 = kernel[iVar3 - lVar4];
      for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        *(float *)((long)pvVar2 + uVar6 * 4) =
             pfVar5[uVar6] * fVar1 + *(float *)((long)pvVar2 + uVar6 * 4);
      }
      fVar10 = fVar10 + fVar1;
    }
    pfVar5 = pfVar5 + (long)W * (long)dim;
  }
  if (0.0 < fVar10) {
    for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
      output[(long)((W * y + x) * dim) + uVar6] = *(float *)((long)pvVar2 + uVar6 * 4) / fVar10;
    }
  }
  operator_delete__(pvVar2);
  return;
}

Assistant:

__SHARED_CODE__
            inline void applyGaussianKernelY(const float *input, float *output, const float *kernel, float sd,
                int dim, int x, int y, int W, int H) {
            float *channelSums = new float[dim];
            for (int i = 0; i < dim; i++) {
                channelSums[i] = 0.0;
            }

            int rad = static_cast<int>(sd);
            float normaliser = 0.0;
            for (int r = -rad; r <= rad; r++) {
                int idx = y + r;
                if (idx < 0 || idx >= H) {
                    continue;
                }

                normaliser += kernel[rad - r];
                for (int i = 0; i < dim; i++) {
                    channelSums[i] += input[(idx*W + x)*dim + i] * kernel[rad - r];
                }
            }

            if (normaliser > 0.0) {
                for (int i = 0; i < dim; i++) {
                    output[(y*W + x)*dim + i] = channelSums[i] / normaliser;
                }
            }
            delete[] channelSums;
        }